

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void serialize_frames(ws_frame *frames,size_t num_frames)

{
  uint8_t *__dest;
  _Bool _Var1;
  cio_websocket_frame_type cVar2;
  frame_direction fVar3;
  void *__src;
  ulong __n;
  uint uVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint16_t len;
  uint8_t mask [4];
  byte local_54 [4];
  ulong local_50;
  ulong local_48;
  ws_frame *local_40;
  size_t local_38;
  
  if (num_frames == 0) {
    frame_buffer_fill_pos = 0xffffffff;
  }
  else {
    uVar12 = 0;
    sVar8 = 0;
    local_40 = frames;
    local_38 = num_frames;
    do {
      cVar2 = local_40[sVar8].frame_type;
      fVar3 = local_40[sVar8].direction;
      __src = local_40[sVar8].data;
      __n = local_40[sVar8].data_length;
      iVar11 = (int)uVar12;
      _Var1 = local_40[sVar8].rsv;
      frame_buffer[uVar12] = local_40[sVar8].last_frame << 7;
      if ((_Var1 & 1U) != 0) {
        frame_buffer[uVar12] = frame_buffer[uVar12] | 0x70;
      }
      frame_buffer[uVar12] = frame_buffer[uVar12] | (byte)cVar2;
      uVar4 = iVar11 + 1;
      frame_buffer[uVar4] = (fVar3 == FROM_CLIENT) << 7;
      if (__n < 0x7e) {
        frame_buffer[uVar4] = frame_buffer[uVar4] | (byte)__n;
        iVar5 = 2;
      }
      else if (__n < 0x10000) {
        frame_buffer[uVar4] = frame_buffer[uVar4] | 0x7e;
        *(short *)(frame_buffer + (iVar11 + 2)) = (short)__n;
        iVar5 = 4;
      }
      else {
        frame_buffer[uVar4] = frame_buffer[uVar4] | 0x7f;
        *(ulong *)(frame_buffer + (iVar11 + 2)) = __n;
        iVar5 = 10;
      }
      uVar12 = (ulong)(uint)(iVar11 + iVar5);
      local_54[0] = 1;
      local_54[1] = 2;
      local_54[2] = 3;
      local_54[3] = 4;
      if (fVar3 == FROM_CLIENT) {
        builtin_memcpy(frame_buffer + uVar12,"\x01\x02\x03\x04",4);
        uVar12 = (ulong)(iVar11 + iVar5 + 4);
      }
      if (__n != 0) {
        __dest = frame_buffer + uVar12;
        local_48 = uVar12;
        memcpy(__dest,__src,__n);
        if (fVar3 == FROM_CLIENT) {
          local_50 = 0;
          if (__n < 8) {
            uVar6 = 0;
            do {
              __dest[uVar6] = __dest[uVar6] ^ local_54[(uint)uVar6 & 3];
              uVar6 = uVar6 + 1;
            } while (__n != uVar6);
          }
          else {
            uVar7 = (ulong)(-(int)__dest & 7);
            uVar6 = __n - uVar7;
            lVar9 = 0;
            do {
              *(byte *)((long)&local_50 + lVar9) = local_54[(int)lVar9 - (int)__dest & 3];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 8);
            if (uVar7 != 0) {
              lVar9 = 0;
              do {
                __dest[lVar9] = __dest[lVar9] ^ local_54[(uint)lVar9 & 3];
                lVar9 = lVar9 + 1;
              } while (((byte)-(char)uVar12 & 7) != (uint)lVar9);
            }
            if (7 < uVar6) {
              uVar10 = 0;
              do {
                *(ulong *)(__dest + uVar10 * 8 + uVar7) =
                     *(ulong *)(__dest + uVar10 * 8 + uVar7) ^ local_50;
                uVar10 = uVar10 + 1;
              } while (uVar6 >> 3 != uVar10);
            }
            uVar6 = (ulong)((uint)uVar6 & 7);
            if (__n - uVar6 < __n) {
              lVar9 = -uVar6;
              do {
                frame_buffer[local_48 + __n + lVar9] =
                     frame_buffer[local_48 + __n + lVar9] ^ local_54[(int)__n + (int)lVar9 & 3];
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0);
            }
          }
        }
        uVar12 = (ulong)(uint)((int)uVar12 + (int)__n);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != local_38);
    frame_buffer_fill_pos = (size_t)((int)uVar12 - 1);
  }
  return;
}

Assistant:

static void serialize_frames(struct ws_frame frames[], size_t num_frames)
{
	uint32_t buffer_pos = 0;
	for (size_t i = 0; i < num_frames; i++) {
		struct ws_frame frame = frames[i];
		if (frame.last_frame) {
			frame_buffer[buffer_pos] = WS_HEADER_FIN;
		} else {
			frame_buffer[buffer_pos] = 0x0;
		}

		if (frame.rsv) {
			frame_buffer[buffer_pos] |= 0x70;
		}

		frame_buffer[buffer_pos] = (uint8_t)(frame_buffer[buffer_pos] | frame.frame_type);
		buffer_pos++;

		if (frame.direction == FROM_CLIENT) {
			frame_buffer[buffer_pos] = WS_MASK_SET;
		} else {
			frame_buffer[buffer_pos] = 0x00;
		}

		if (frame.data_length <= 125) {
			frame_buffer[buffer_pos] = (uint8_t)((unsigned int)frame_buffer[buffer_pos] | (unsigned int)frame.data_length);
			buffer_pos++;
		} else if (frame.data_length < 65536) {
			uint16_t len = (uint16_t)frame.data_length;
			frame_buffer[buffer_pos] |= 126;
			buffer_pos++;
			len = cio_htobe16(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		} else {
			frame_buffer[buffer_pos] |= 127;
			buffer_pos++;
			uint64_t len = (uint64_t)frame.data_length;
			len = cio_htobe64(len);
			memcpy(&frame_buffer[buffer_pos], &len, sizeof(len));
			buffer_pos += (uint32_t)sizeof(len);
		}

		uint8_t mask[4] = {0x1, 0x2, 0x3, 0x4};
		if (frame.direction == FROM_CLIENT) {
			memcpy(&frame_buffer[buffer_pos], mask, sizeof(mask));
			buffer_pos += (uint32_t)sizeof(mask);
		}

		if (frame.data_length > 0) {
			memcpy(&frame_buffer[buffer_pos], frame.data, frame.data_length);
			if (frame.direction == FROM_CLIENT) {
				cio_websocket_mask(&frame_buffer[buffer_pos], frame.data_length, mask);
			}

			buffer_pos += (uint32_t)frame.data_length;
		}
	}

	frame_buffer_fill_pos = buffer_pos - 1;
}